

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O1

void spell_neutralize(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  AFFECT_DATA af;
  AFFECT_DATA AStack_98;
  
  bVar1 = is_affected((CHAR_DATA *)vo,(int)gsn_neutralize);
  if (bVar1) {
    act("$N is already neutralized.",ch,(void *)0x0,vo,3);
    return;
  }
  send_to_char("Your body becomes tempered against acids.\n\r",(CHAR_DATA *)vo);
  act("$n\'s skin flushes slightly green for a moment, then returns to normal.",(CHAR_DATA *)vo,
      (void *)0x0,(void *)0x0,0);
  init_affect(&AStack_98);
  AStack_98.where = 2;
  AStack_98.aftype = 0;
  AStack_98.type = gsn_neutralize;
  AStack_98.duration = (short)(level / 3);
  AStack_98.location = 0;
  AStack_98.modifier = 0;
  AStack_98.level = (short)level;
  if ((CHAR_DATA *)vo == ch) {
    AStack_98.bitvector[0]._1_1_ = AStack_98.bitvector[0]._1_1_ | 4;
    affect_to_char((CHAR_DATA *)vo,&AStack_98);
    zero_vector(AStack_98.bitvector);
    AStack_98.bitvector[0]._1_1_ = AStack_98.bitvector[0]._1_1_ | 8;
    AStack_98.aftype = 5;
  }
  else {
    AStack_98.bitvector[0]._1_1_ = AStack_98.bitvector[0]._1_1_ | 4;
  }
  AStack_98.where = 3;
  AStack_98.mod_name = 0xc;
  affect_to_char((CHAR_DATA *)vo,&AStack_98);
  return;
}

Assistant:

void spell_neutralize(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af;

	if (is_affected(victim, gsn_neutralize))
	{
		act("$N is already neutralized.", ch, 0, victim, TO_CHAR);
		return;
	}

	send_to_char("Your body becomes tempered against acids.\n\r", victim);
	act("$n's skin flushes slightly green for a moment, then returns to normal.", victim, 0, 0, TO_ROOM);

	init_affect(&af);
	af.where = TO_IMMUNE;
	af.aftype = AFT_SPELL;
	af.type = gsn_neutralize;
	af.level = level;
	af.duration = level / 3;
	af.modifier = 0;
	af.location = 0;

	if (victim == ch)
	{
		SET_BIT(af.bitvector, IMM_ACID);
		affect_to_char(victim, &af);

		zero_vector(af.bitvector);

		SET_BIT(af.bitvector, RES_POISON);
		af.where = TO_RESIST;
		af.aftype = AFT_INVIS;
	}
	else
	{
		af.where = TO_RESIST;
		SET_BIT(af.bitvector, RES_ACID);
	}

	af.mod_name = MOD_RESISTANCE;
	affect_to_char(victim, &af);
}